

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uchar **ppuVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  long lVar6;
  uint uVar7;
  
  ppuVar1 = &dest->palette;
  if (dest->palette != (uchar *)0x0) {
    free(dest->palette);
  }
  *ppuVar1 = (uchar *)0x0;
  dest->palettesize = 0;
  uVar7 = source->key_b;
  dest->key_g = source->key_g;
  dest->key_b = uVar7;
  uVar7 = source->bitdepth;
  puVar5 = source->palette;
  sVar2 = source->palettesize;
  uVar3 = source->key_defined;
  uVar4 = source->key_r;
  dest->colortype = source->colortype;
  dest->bitdepth = uVar7;
  dest->palette = puVar5;
  dest->palettesize = sVar2;
  dest->key_defined = uVar3;
  dest->key_r = uVar4;
  uVar7 = 0;
  if (source->palette != (uchar *)0x0) {
    puVar5 = (uchar *)malloc(0x400);
    *ppuVar1 = puVar5;
    if (puVar5 == (uchar *)0x0) {
      uVar7 = 0x53;
      if (source->palettesize == 0) {
        uVar7 = 0;
      }
    }
    else {
      uVar7 = 0;
      if ((source->palettesize & 0x3fffffffffffffff) != 0) {
        uVar7 = 0;
        lVar6 = 0;
        do {
          (*ppuVar1)[lVar6] = source->palette[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar6 != source->palettesize << 2);
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source)
{
  size_t i;
  lodepng_color_mode_cleanup(dest);
  *dest = *source;
  if(source->palette)
  {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if(!dest->palette && source->palettesize) return 83; /*alloc fail*/
    for(i = 0; i != source->palettesize * 4; ++i) dest->palette[i] = source->palette[i];
  }
  return 0;
}